

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O2

void __thiscall icu_63::RBBIRuleScanner::fixOpStack(RBBIRuleScanner *this,OpPrecedence p)

{
  OpPrecedence OVar1;
  RBBINode *this_00;
  RBBINode *pRVar2;
  int iVar3;
  ulong uVar4;
  OpPrecedence OVar5;
  RBBINode **ppRVar6;
  undefined4 in_register_00000034;
  void *p_00;
  
  p_00 = (void *)CONCAT44(in_register_00000034,p);
  OVar5 = precOpOr;
  if (3 < (int)p) {
    OVar5 = p;
  }
  uVar4 = (ulong)this->fNodeStackPtr;
  ppRVar6 = this->fNodeStack + uVar4;
  while( true ) {
    iVar3 = (int)uVar4;
    this_00 = ppRVar6[-1];
    OVar1 = this_00->fPrecedence;
    if (OVar1 == precZero) {
      error(this,U_BRK_ERROR_START);
      return;
    }
    if ((int)OVar1 < (int)OVar5) break;
    pRVar2 = *ppRVar6;
    this_00->fRightChild = pRVar2;
    pRVar2->fParent = this_00;
    uVar4 = (ulong)(iVar3 - 1U);
    this->fNodeStackPtr = iVar3 - 1U;
    ppRVar6 = ppRVar6 + -1;
  }
  if ((int)p < 3) {
    if (OVar1 != p) {
      p_00 = (void *)0x10207;
      error(this,U_BRK_MISMATCHED_PAREN);
      iVar3 = this->fNodeStackPtr;
    }
    this->fNodeStack[(long)iVar3 + -1] = this->fNodeStack[iVar3];
    this->fNodeStackPtr = iVar3 + -1;
    RBBINode::~RBBINode(this_00);
    UMemory::operator_delete((UMemory *)this_00,p_00);
    return;
  }
  return;
}

Assistant:

void RBBIRuleScanner::fixOpStack(RBBINode::OpPrecedence p) {
    RBBINode *n;
    // printNodeStack("entering fixOpStack()");
    for (;;) {
        n = fNodeStack[fNodeStackPtr-1];   // an operator node
        if (n->fPrecedence == 0) {
            RBBIDebugPuts("RBBIRuleScanner::fixOpStack, bad operator node");
            error(U_BRK_INTERNAL_ERROR);
            return;
        }

        if (n->fPrecedence < p || n->fPrecedence <= RBBINode::precLParen) {
            // The most recent operand goes with the current operator,
            //   not with the previously stacked one.
            break;
        }
            // Stack operator is a binary op  ( '|' or concatenation)
            //   TOS operand becomes right child of this operator.
            //   Resulting subexpression becomes the TOS operand.
            n->fRightChild = fNodeStack[fNodeStackPtr];
            fNodeStack[fNodeStackPtr]->fParent = n;
            fNodeStackPtr--;
        // printNodeStack("looping in fixOpStack()   ");
    }

    if (p <= RBBINode::precLParen) {
        // Scan is at a right paren or end of expression.
        //  The scanned item must match the stack, or else there was an error.
        //  Discard the left paren (or start expr) node from the stack,
            //  leaving the completed (sub)expression as TOS.
            if (n->fPrecedence != p) {
                // Right paren encountered matched start of expression node, or
                // end of expression matched with a left paren node.
                error(U_BRK_MISMATCHED_PAREN);
            }
            fNodeStack[fNodeStackPtr-1] = fNodeStack[fNodeStackPtr];
            fNodeStackPtr--;
            // Delete the now-discarded LParen or Start node.
            delete n;
    }
    // printNodeStack("leaving fixOpStack()");
}